

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createSphere(BulletEngine *this,aphy_scalar radius)

{
  collision_shape_ptr prVar1;
  btSphereShape *this_00;
  collision_shape_ptr local_18;
  
  this_00 = (btSphereShape *)btSphereShape::operator_new(0x48);
  btSphereShape::btSphereShape(this_00,radius);
  aphy::
  makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btSphereShape*>
            ((aphy *)&local_18,this_00);
  prVar1 = local_18;
  local_18 = (collision_shape_ptr)0x0;
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)&local_18);
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createSphere(aphy_scalar radius)
{
    return makeObject<BulletCollisionShape> (
        new btSphereShape(radius)
    ).disown();
}